

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::completerActivated(QComboBoxPrivate *this,QModelIndex *index)

{
  bool bVar1;
  int iVar2;
  QCompleter *pQVar3;
  QAbstractProxyModel *pQVar4;
  QAbstractItemModel *pQVar5;
  undefined8 in_RSI;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QAbstractProxyModel *completerProxy;
  int row;
  QModelIndex *completerIndex;
  QAbstractProxyModel *proxy;
  QComboBox *q;
  QString match;
  undefined4 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::MatchFlag> in_stack_ffffffffffffff3c;
  QComboBoxPrivate *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  QFlagsStorage<Qt::MatchFlag> flags;
  QPersistentModelIndex local_88 [3];
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  QModelIndex local_58;
  QModelIndex local_40;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  bVar1 = QModelIndex::isValid((QModelIndex *)in_RDI);
  if ((bVar1) && (pQVar3 = QComboBox::completer((QComboBox *)in_RDI), pQVar3 != (QCompleter *)0x0))
  {
    QComboBox::completer((QComboBox *)in_RDI);
    QCompleter::completionModel((QCompleter *)in_RDI);
    pQVar4 = qobject_cast<QAbstractProxyModel*>((QObject *)0x53067b);
    if (pQVar4 != (QAbstractProxyModel *)0x0) {
      (**(code **)(*(long *)pQVar4 + 400))(&local_40,pQVar4,in_RSI);
      flags.i = 0xffffffff;
      pQVar5 = QModelIndex::model((QModelIndex *)0x5306d5);
      if (pQVar5 == in_RDI->model) {
        iVar2 = QModelIndex::row(&local_40);
      }
      else {
        QComboBox::completer((QComboBox *)in_RDI);
        QCompleter::model((QCompleter *)in_RDI);
        in_stack_ffffffffffffff40 =
             (QComboBoxPrivate *)qobject_cast<QAbstractProxyModel*>((QObject *)0x530710);
        if ((in_stack_ffffffffffffff40 == (QComboBoxPrivate *)0x0) ||
           (pQVar5 = (QAbstractItemModel *)QAbstractProxyModel::sourceModel(),
           pQVar5 != in_RDI->model)) {
          local_70 = &DAT_aaaaaaaaaaaaaaaa;
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          local_60 = &DAT_aaaaaaaaaaaaaaaa;
          QComboBox::completer((QComboBox *)in_RDI);
          pQVar5 = QCompleter::model((QCompleter *)in_RDI);
          (**(code **)(*(long *)pQVar5 + 0x90))(&local_28,pQVar5,&local_40,0);
          ::QVariant::toString();
          ::QVariant::~QVariant(&local_28);
          in_stack_ffffffffffffff3c.i = (Int)matchFlags(in_RDI);
          iVar2 = QComboBox::findText((QComboBox *)in_stack_ffffffffffffff40,
                                      (QString *)
                                      CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38
                                              ),(MatchFlags)flags.i);
          QString::~QString((QString *)0x53080d);
        }
        else {
          (**(code **)(*(long *)&in_stack_ffffffffffffff40->super_QWidgetPrivate + 400))
                    (&local_58,in_stack_ffffffffffffff40,&local_40);
          iVar2 = QModelIndex::row(&local_58);
        }
      }
      QComboBox::setCurrentIndex
                ((QComboBox *)CONCAT44(iVar2,in_stack_ffffffffffffff48),
                 (int)((ulong)in_stack_ffffffffffffff40 >> 0x20));
      QPersistentModelIndex::operator_cast_to_QModelIndex(local_88);
      emitActivated(in_stack_ffffffffffffff40,
                    (QModelIndex *)CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QComboBoxPrivate::completerActivated(const QModelIndex &index)
{
    Q_Q(QComboBox);
#if QT_CONFIG(proxymodel)
    if (index.isValid() && q->completer()) {
        QAbstractProxyModel *proxy = qobject_cast<QAbstractProxyModel *>(q->completer()->completionModel());
        if (proxy) {
            const QModelIndex &completerIndex = proxy->mapToSource(index);
            int row = -1;
            if (completerIndex.model() == model) {
                row = completerIndex.row();
            } else {
                // if QCompleter uses a proxy model to host widget's one - map again
                QAbstractProxyModel *completerProxy = qobject_cast<QAbstractProxyModel *>(q->completer()->model());
                if (completerProxy && completerProxy->sourceModel() == model) {
                    row = completerProxy->mapToSource(completerIndex).row();
                } else {
                    QString match = q->completer()->model()->data(completerIndex).toString();
                    row = q->findText(match, matchFlags());
                }
            }
            q->setCurrentIndex(row);
            emitActivated(currentIndex);
        }
    }
#endif
}